

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_node::previous_sibling(xml_node *this,char_t *name_)

{
  bool bVar1;
  xml_node_struct *pxVar2;
  
  pxVar2 = this->_root;
  if (pxVar2 == (xml_node_struct *)0x0) {
LAB_0012af41:
    pxVar2 = (xml_node_struct *)0x0;
  }
  else {
    do {
      pxVar2 = pxVar2->prev_sibling_c;
      if (pxVar2->next_sibling == (xml_node_struct *)0x0) goto LAB_0012af41;
    } while ((pxVar2->name == (char_t *)0x0) ||
            (bVar1 = impl::anon_unknown_0::strequal(name_,pxVar2->name), !bVar1));
  }
  return (xml_node)pxVar2;
}

Assistant:

PUGI__FN xml_node xml_node::previous_sibling(const char_t* name_) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->prev_sibling_c; i->next_sibling; i = i->prev_sibling_c)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_node(i);
		}

		return xml_node();
	}